

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O2

long parse_auth_name(char *arg)

{
  int iVar1;
  long lStack_10;
  
  if (arg != (char *)0x0) {
    iVar1 = curl_strequal(arg,"basic");
    if (iVar1 == 0) {
      iVar1 = curl_strequal(arg,"digest");
      if (iVar1 == 0) {
        iVar1 = curl_strequal(arg,"ntlm");
        lStack_10 = (ulong)(iVar1 != 0) << 3;
      }
      else {
        lStack_10 = 2;
      }
    }
    else {
      lStack_10 = 1;
    }
    return lStack_10;
  }
  return 0;
}

Assistant:

static long parse_auth_name(const char *arg)
{
  if(!arg)
    return CURLAUTH_NONE;
  if(curl_strequal(arg, "basic"))
    return CURLAUTH_BASIC;
  if(curl_strequal(arg, "digest"))
    return CURLAUTH_DIGEST;
  if(curl_strequal(arg, "ntlm"))
    return CURLAUTH_NTLM;
  return CURLAUTH_NONE;
}